

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashids.hpp
# Opt level: O0

string * __thiscall
hashidsxx::Hashids::encode<int_const*>
          (string *__return_storage_ptr__,Hashids *this,int *begin,int *end)

{
  int iVar1;
  string *psVar2;
  string *psVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  string last;
  string alphabet_salt;
  uint64_t number;
  int *iter_1;
  char lottery;
  int *piStack_70;
  char encoded;
  int *iter;
  int i;
  int values_hash;
  string alphabet;
  allocator local_29;
  int *local_28;
  int *end_local;
  int *begin_local;
  Hashids *this_local;
  string *output;
  
  local_28 = end;
  end_local = begin;
  begin_local = (int *)this;
  this_local = (Hashids *)__return_storage_ptr__;
  if (begin == end) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::string((string *)&i,(string *)&this->_alphabet);
    iter._4_4_ = 0;
    iter._0_4_ = 0;
    for (piStack_70 = end_local; piStack_70 != local_28; piStack_70 = piStack_70 + 1) {
      iter._4_4_ = *piStack_70 % ((int)iter + 100) + iter._4_4_;
      iter._0_4_ = (int)iter + 1;
    }
    std::__cxx11::string::size();
    std::__cxx11::string::operator[]((ulong)&this->_alphabet);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    if (this->_min_length != 0) {
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    for (number = (uint64_t)end_local; (int *)number != local_28; number = number + 4) {
      iVar1 = *(int *)number;
      std::__cxx11::string::string((string *)(&last.field_2._M_allocated_capacity + 1));
      std::__cxx11::string::push_back((char)(string *)(&last.field_2._M_allocated_capacity + 1));
      psVar2 = (string *)std::__cxx11::string::append((string *)(last.field_2._M_local_buf + 8));
      std::__cxx11::string::append(psVar2);
      psVar3 = _reorder(this,(string *)&i,(string *)((long)&last.field_2 + 8));
      std::__cxx11::string::operator=((string *)&i,(string *)psVar3);
      _hash((string *)local_c8,this,(long)iVar1,(string *)&i);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::operator[]((ulong)local_c8);
      std::__cxx11::string::size();
      std::__cxx11::string::operator[]((ulong)&this->_separators);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)(last.field_2._M_local_buf + 8));
    }
    local_e0._M_current = (char *)std::__cxx11::string::end();
    local_d8 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_e0,1);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_d0,&local_d8);
    std::__cxx11::string::erase(__return_storage_ptr__,local_d0);
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < this->_min_length) {
      _ensure_length(this,__return_storage_ptr__,(string *)&i,iter._4_4_);
    }
    std::__cxx11::string::~string((string *)&i);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encode(const Iterator begin, const Iterator end) const {
    // Encrypting nothing makes no sense
    if (begin == end)
      return "";

    // Make a copy of our alphabet so we can reorder it on the fly etc
    std::string alphabet(_alphabet);

    int values_hash = 0;
    int i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      values_hash += (*iter % (i + 100));
      ++i;
    };

    char encoded = _alphabet[values_hash % _alphabet.size()];
    char lottery = encoded;

    std::string output;
    if (_min_length > 0)
      output.reserve(_min_length); // reserve if we have a minimum length
    output.push_back(encoded);

    i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      uint64_t number = *iter;

      std::string alphabet_salt;
      alphabet_salt.push_back(lottery);
      alphabet_salt.append(_salt).append(alphabet);

      alphabet = _reorder(alphabet, alphabet_salt);

      std::string last = _hash(number, alphabet);
      output.append(last);

      number %= last[0] + i;
      output.push_back(_separators[number % _separators.size()]);
      ++i;
    };

    // pop_back() is only available with C++11
    output.erase(output.end() - 1);

    if (output.size() < _min_length)
      _ensure_length(output, alphabet, values_hash);

    return output;
  }